

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_winograd_transform.h
# Opt level: O1

void ncnn::conv3x3s1_winograd63_transform_output_sse
               (Mat *top_blob_tm,Mat *top_blob,Mat *bias,Option *opt)

{
  long lVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  void *pvVar6;
  void *pvVar7;
  size_t sVar8;
  size_t sVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  uint uVar18;
  uint uVar19;
  void *pvVar20;
  void *pvVar21;
  ulong uVar22;
  long lVar23;
  int iVar24;
  void *pvVar25;
  ulong uVar26;
  void *pvVar27;
  long lVar28;
  float *pfVar29;
  long lVar30;
  long lVar31;
  long lVar32;
  void *pvVar33;
  void *pvVar34;
  void *pvVar35;
  float *pfVar36;
  undefined1 auVar37 [16];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  float fVar41;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [64];
  undefined1 auVar48 [64];
  undefined1 auVar49 [64];
  float tmp [6] [8];
  float *local_1f0;
  long local_1e8;
  void *local_1e0;
  void *local_1d8;
  void *local_1d0;
  void *local_1c8;
  void *local_1c0;
  void *local_1b8;
  void *local_1b0;
  float *local_1a8;
  long local_1a0;
  void *local_198;
  void *local_190;
  void *local_188;
  void *local_180;
  void *local_178;
  void *local_170;
  void *local_168;
  float afStack_f8 [5];
  ulong uStack_e4;
  float afStack_dc [43];
  
  iVar2 = top_blob->c;
  if (0 < (long)iVar2) {
    iVar3 = top_blob->w;
    iVar4 = top_blob->h;
    uVar18 = iVar3 / 6;
    uVar19 = iVar4 / 6;
    pvVar6 = bias->data;
    iVar24 = uVar19 * uVar18;
    pvVar7 = top_blob_tm->data;
    iVar5 = top_blob->w;
    sVar8 = top_blob->elemsize;
    lVar31 = top_blob_tm->cstep * top_blob_tm->elemsize;
    sVar9 = top_blob->cstep;
    local_1b0 = (void *)((long)pvVar7 + (long)iVar24 * 4);
    local_1b8 = (void *)((long)pvVar7 + (long)(iVar24 * 2) * 4);
    local_1c0 = (void *)((long)pvVar7 + (long)(iVar24 * 3) * 4);
    local_1c8 = (void *)((long)pvVar7 + (long)(iVar24 * 4) * 4);
    local_1d0 = (void *)((long)pvVar7 + (long)(iVar24 * 5) * 4);
    local_1d8 = (void *)((long)pvVar7 + (long)(iVar24 * 6) * 4);
    local_1e0 = (void *)((long)pvVar7 + (long)(iVar24 * 7) * 4);
    local_1a8 = (float *)((long)top_blob->data + 0x14);
    auVar38 = ZEXT464(0x42000000);
    auVar39 = ZEXT464(0x40800000);
    auVar48 = ZEXT464(0x41000000);
    auVar40 = ZEXT464(0x41800000);
    auVar47 = ZEXT1664(_DAT_0054e840);
    lVar1 = (ulong)uVar18 * 4;
    local_1e8 = 0;
    lVar23 = 0;
    do {
      if (pvVar6 == (void *)0x0) {
        fVar41 = 0.0;
      }
      else {
        fVar41 = *(float *)((long)pvVar6 + lVar23 * 4);
      }
      if (5 < iVar4) {
        local_1f0 = local_1a8;
        local_168 = local_1e0;
        local_170 = local_1d8;
        local_178 = local_1d0;
        local_180 = local_1c8;
        local_188 = local_1c0;
        local_190 = local_1b8;
        local_198 = local_1b0;
        local_1a0 = local_1e8;
        uVar22 = 0;
        do {
          if (5 < iVar3) {
            uVar26 = 0;
            pvVar20 = local_178;
            pvVar21 = local_198;
            pvVar25 = local_168;
            pvVar27 = local_190;
            lVar30 = local_1a0;
            pvVar33 = local_188;
            pvVar34 = local_180;
            pvVar35 = local_170;
            pfVar36 = local_1f0;
            do {
              lVar32 = -8;
              lVar28 = 0;
              do {
                fVar10 = *(float *)((long)pvVar27 + lVar28) + *(float *)((long)pvVar21 + lVar28);
                fVar13 = *(float *)((long)pvVar21 + lVar28) - *(float *)((long)pvVar27 + lVar28);
                fVar11 = *(float *)((long)pvVar34 + lVar28) + *(float *)((long)pvVar33 + lVar28);
                fVar14 = *(float *)((long)pvVar33 + lVar28) - *(float *)((long)pvVar34 + lVar28);
                fVar12 = *(float *)((long)pvVar35 + lVar28) + *(float *)((long)pvVar20 + lVar28);
                fVar15 = *(float *)((long)pvVar20 + lVar28) - *(float *)((long)pvVar35 + lVar28);
                auVar17 = vfmadd231ss_fma(ZEXT416((uint)(fVar11 + fVar10 +
                                                        *(float *)((long)pvVar7 + lVar28 + lVar30)))
                                          ,ZEXT416((uint)fVar12),auVar38._0_16_);
                afStack_dc[lVar32 + 1] = auVar17._0_4_;
                auVar17 = vfmadd213ss_fma(auVar39._0_16_,ZEXT416((uint)fVar11),ZEXT416((uint)fVar10)
                                         );
                auVar17 = vfmadd231ss_fma(auVar17,ZEXT416((uint)fVar12),auVar48._0_16_);
                afStack_dc[lVar32 + 0x11] = auVar17._0_4_;
                auVar17 = vfmadd213ss_fma(ZEXT416((uint)fVar11),auVar40._0_16_,ZEXT416((uint)fVar10)
                                         );
                auVar17 = vfmadd231ss_fma(auVar17,SUB6416(ZEXT464(0x40000000),0),
                                          ZEXT416((uint)fVar12));
                afStack_dc[lVar32 + 0x21] = auVar17._0_4_;
                auVar17 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40000000),0),ZEXT416((uint)fVar14),
                                          ZEXT416((uint)fVar13));
                auVar17 = vfmadd231ss_fma(auVar17,ZEXT416((uint)fVar15),auVar40._0_16_);
                afStack_dc[lVar32 + 9] = auVar17._0_4_;
                auVar17 = vfmadd213ss_fma(auVar48._0_16_,ZEXT416((uint)fVar14),ZEXT416((uint)fVar13)
                                         );
                auVar17 = vfmadd231ss_fma(auVar17,ZEXT416((uint)fVar15),auVar39._0_16_);
                afStack_dc[lVar32 + 0x19] = auVar17._0_4_;
                auVar17 = vfmadd213ss_fma(ZEXT416((uint)fVar14),auVar38._0_16_,ZEXT416((uint)fVar13)
                                         );
                afStack_dc[lVar32 + 0x29] =
                     auVar17._0_4_ + fVar15 + *(float *)((long)pvVar25 + lVar28);
                lVar28 = lVar28 + (long)(iVar24 * 8) * 4;
                lVar32 = lVar32 + 1;
              } while (lVar32 != 0);
              lVar28 = 0;
              pfVar29 = pfVar36;
              auVar49 = auVar48;
              do {
                fVar10 = *(float *)((long)afStack_f8 + lVar28 + 4);
                fVar11 = *(float *)((long)afStack_f8 + lVar28 + 8);
                fVar12 = *(float *)((long)afStack_f8 + lVar28 + 0xc);
                fVar13 = *(float *)((long)afStack_f8 + lVar28 + 0x10);
                fVar14 = fVar13 + fVar12;
                fVar12 = fVar12 - fVar13;
                fVar13 = fVar11 + fVar10 + fVar41;
                auVar16 = vfmadd132ss_fma(ZEXT416((uint)fVar14),ZEXT416((uint)fVar13),auVar40._0_16_
                                         );
                auVar45._8_8_ = 0;
                auVar45._0_8_ = *(ulong *)((long)&uStack_e4 + lVar28);
                auVar37 = auVar38._0_16_;
                auVar46 = auVar47._0_16_;
                auVar44 = vhaddps_avx(auVar45,auVar45);
                auVar17 = vshufps_avx(auVar45,auVar45,0xe1);
                auVar45 = vsubps_avx(auVar17,auVar45);
                auVar17 = vblendps_avx(auVar44,auVar45,2);
                auVar16 = vfmadd132ss_fma(auVar44,auVar16,ZEXT416(0x40000000));
                auVar44 = vinsertps_avx(ZEXT416(*(uint *)((long)afStack_f8 + lVar28)),
                                        ZEXT416((uint)(fVar12 + fVar12)),0x10);
                auVar48 = ZEXT1664(auVar49._0_16_);
                auVar44 = vinsertps_avx(auVar44,ZEXT416((uint)(fVar14 * auVar39._0_4_)),0x20);
                auVar44 = vinsertps_avx(auVar44,ZEXT416((uint)(fVar12 * auVar49._0_4_)),0x30);
                pfVar29[-1] = auVar16._0_4_;
                auVar47 = ZEXT1664(auVar46);
                auVar38 = ZEXT1664(auVar37);
                auVar40 = ZEXT1664(auVar40._0_16_);
                auVar39 = ZEXT1664(auVar39._0_16_);
                auVar42 = ZEXT416((uint)((fVar10 - fVar11) + fVar41));
                auVar16 = vinsertps_avx(ZEXT416((uint)(fVar13 + fVar14)),auVar42,0x10);
                auVar16 = vinsertps_avx(auVar16,ZEXT416((uint)fVar13),0x20);
                auVar16 = vshufps_avx(auVar16,auVar16,100);
                auVar43._0_4_ = auVar16._0_4_ + auVar44._0_4_;
                auVar43._4_4_ = auVar16._4_4_ + auVar44._4_4_;
                auVar43._8_4_ = auVar16._8_4_ + auVar44._8_4_;
                auVar43._12_4_ = auVar16._12_4_ + auVar44._12_4_;
                auVar44._8_8_ = auVar17._0_8_;
                auVar44._0_8_ = auVar17._0_8_;
                auVar17 = vfmadd231ps_fma(auVar43,auVar44,auVar46);
                *(undefined1 (*) [16])(pfVar29 + -5) = auVar17;
                auVar44 = vfmadd231ss_fma(auVar42,ZEXT416((uint)fVar12),auVar37);
                auVar17 = vmovshdup_avx(auVar45);
                *pfVar29 = auVar44._0_4_ + auVar17._0_4_ + *(float *)((long)afStack_dc + lVar28);
                lVar28 = lVar28 + 0x20;
                pfVar29 = pfVar29 + iVar3;
                auVar49 = auVar48;
              } while (lVar28 != 0xc0);
              uVar26 = uVar26 + 1;
              lVar30 = lVar30 + 4;
              pvVar21 = (void *)((long)pvVar21 + 4);
              pvVar27 = (void *)((long)pvVar27 + 4);
              pvVar33 = (void *)((long)pvVar33 + 4);
              pvVar34 = (void *)((long)pvVar34 + 4);
              pvVar20 = (void *)((long)pvVar20 + 4);
              pvVar35 = (void *)((long)pvVar35 + 4);
              pvVar25 = (void *)((long)pvVar25 + 4);
              pfVar36 = pfVar36 + 6;
            } while (uVar26 != uVar18);
          }
          uVar22 = uVar22 + 1;
          local_1a0 = local_1a0 + lVar1;
          local_198 = (void *)((long)local_198 + lVar1);
          local_190 = (void *)((long)local_190 + lVar1);
          local_188 = (void *)((long)local_188 + lVar1);
          local_180 = (void *)((long)local_180 + lVar1);
          local_178 = (void *)((long)local_178 + lVar1);
          local_170 = (void *)((long)local_170 + lVar1);
          local_168 = (void *)((long)local_168 + lVar1);
          local_1f0 = (float *)((long)local_1f0 + (long)iVar5 * sVar8 * 6);
        } while (uVar22 != uVar19);
      }
      lVar23 = lVar23 + 1;
      local_1e8 = local_1e8 + lVar31;
      local_1b0 = (void *)((long)local_1b0 + lVar31);
      local_1b8 = (void *)((long)local_1b8 + lVar31);
      local_1c0 = (void *)((long)local_1c0 + lVar31);
      local_1c8 = (void *)((long)local_1c8 + lVar31);
      local_1d0 = (void *)((long)local_1d0 + lVar31);
      local_1d8 = (void *)((long)local_1d8 + lVar31);
      local_1e0 = (void *)((long)local_1e0 + lVar31);
      local_1a8 = (float *)((long)local_1a8 + sVar8 * sVar9);
    } while (lVar23 != iVar2);
  }
  return;
}

Assistant:

static void conv3x3s1_winograd63_transform_output_sse(const Mat& top_blob_tm, Mat& top_blob, const Mat& bias, const Option& opt)
{
    const int outw = top_blob.w;
    const int outh = top_blob.h;
    const int outch = top_blob.c;

    const int w_tiles = outw / 6;
    const int h_tiles = outh / 6;
    const int tiles = w_tiles * h_tiles;

    const float* biasptr = bias;

    // const float otm[6][8] = {
    //     {1.0f,  1.0f,   1.0f,   1.0f,   1.0f,  32.0f, 32.0f, 0.0f},
    //     {0.0f,  1.0f,  -1.0f,   2.0f,  -2.0f,  16.0f,-16.0f, 0.0f},
    //     {0.0f,  1.0f,   1.0f,   4.0f,   4.0f,   8.0f,  8.0f, 0.0f},
    //     {0.0f,  1.0f,  -1.0f,   8.0f,  -8.0f,   4.0f, -4.0f, 0.0f},
    //     {0.0f,  1.0f,   1.0f,  16.0f,  16.0f,   2.0f,  2.0f, 0.0f},
    //     {0.0f,  1.0f,  -1.0f,  32.0f, -32.0f,   1.0f, -1.0f, 1.0f}
    // };

    // 0 = r0 + (r1 + r2) + (r3 + r4)     + (r5 + r6) * 32
    // 1 =      (r1 - r2) + (r3 - r4) * 2 + (r5 - r6) * 16
    // 2 =      (r1 + r2) + (r3 + r4) * 4 + (r5 + r6) * 8
    // 3 =      (r1 - r2) + (r3 - r4) * 8 + (r5 - r6) * 4
    // 4 =      (r1 + r2) + (r3 + r4) * 16+ (r5 + r6) * 2
    // 5 = r7 + (r1 - r2) + (r3 - r4) * 32+ (r5 - r6)

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        const Mat out0_tm = top_blob_tm.channel(p);
        Mat out0 = top_blob.channel(p);

        const float bias0 = biasptr ? biasptr[p] : 0.f;

        float tmp[6][8];

        // tile
        for (int i = 0; i < h_tiles; i++)
        {
            for (int j = 0; j < w_tiles; j++)
            {
                const float* output0_tm_0 = (const float*)out0_tm + (i * w_tiles + j) * 1;
                const float* output0_tm_1 = output0_tm_0 + tiles * 1;
                const float* output0_tm_2 = output0_tm_0 + tiles * 2;
                const float* output0_tm_3 = output0_tm_0 + tiles * 3;
                const float* output0_tm_4 = output0_tm_0 + tiles * 4;
                const float* output0_tm_5 = output0_tm_0 + tiles * 5;
                const float* output0_tm_6 = output0_tm_0 + tiles * 6;
                const float* output0_tm_7 = output0_tm_0 + tiles * 7;

                // TODO sse optimize
                for (int m = 0; m < 8; m++)
                {
                    float tmp024a = output0_tm_1[0] + output0_tm_2[0];
                    float tmp135a = output0_tm_1[0] - output0_tm_2[0];

                    float tmp024b = output0_tm_3[0] + output0_tm_4[0];
                    float tmp135b = output0_tm_3[0] - output0_tm_4[0];

                    float tmp024c = output0_tm_5[0] + output0_tm_6[0];
                    float tmp135c = output0_tm_5[0] - output0_tm_6[0];

                    tmp[0][m] = output0_tm_0[0] + tmp024a + tmp024b + tmp024c * 32;
                    tmp[2][m] = tmp024a + tmp024b * 4 + tmp024c * 8;
                    tmp[4][m] = tmp024a + tmp024b * 16 + tmp024c + tmp024c;

                    tmp[1][m] = tmp135a + tmp135b + tmp135b + tmp135c * 16;
                    tmp[3][m] = tmp135a + tmp135b * 8 + tmp135c * 4;
                    tmp[5][m] = output0_tm_7[0] + tmp135a + tmp135b * 32 + tmp135c;

                    output0_tm_0 += tiles * 8;
                    output0_tm_1 += tiles * 8;
                    output0_tm_2 += tiles * 8;
                    output0_tm_3 += tiles * 8;
                    output0_tm_4 += tiles * 8;
                    output0_tm_5 += tiles * 8;
                    output0_tm_6 += tiles * 8;
                    output0_tm_7 += tiles * 8;
                }

                float* output0 = out0.row(i * 6) + j * 6;

                for (int m = 0; m < 6; m++)
                {
                    const float* tmp0 = tmp[m];

                    float tmp024a = tmp0[1] + tmp0[2];
                    float tmp135a = tmp0[1] - tmp0[2];

                    float tmp024b = tmp0[3] + tmp0[4];
                    float tmp135b = tmp0[3] - tmp0[4];

                    float tmp024c = tmp0[5] + tmp0[6];
                    float tmp135c = tmp0[5] - tmp0[6];

                    output0[0] = bias0 + tmp0[0] + tmp024a + tmp024b + tmp024c * 32;
                    output0[2] = bias0 + tmp024a + tmp024b * 4 + tmp024c * 8;
                    output0[4] = bias0 + tmp024a + tmp024b * 16 + tmp024c + tmp024c;

                    output0[1] = bias0 + tmp135a + tmp135b + tmp135b + tmp135c * 16;
                    output0[3] = bias0 + tmp135a + tmp135b * 8 + tmp135c * 4;
                    output0[5] = bias0 + tmp0[7] + tmp135a + tmp135b * 32 + tmp135c;

                    output0 += outw;
                }
            }
        }
    }
}